

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

AllocaTrackedIndex *
dxil_spv::gep_pointer_to_alloca_tracked_inst
          (AllocaTrackedIndex *__return_storage_ptr__,Impl *impl,Value *ptr)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ValueKind VVar3;
  Instruction *this;
  Value *pVVar4;
  AllocaInst *this_00;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  __node_type *p_Var8;
  Instruction *this_01;
  __hash_code __code;
  AllocaInst *pAVar9;
  
  if (ptr == (Value *)0x0) {
    this_01 = (Instruction *)0x0;
  }
  else {
    this = (Instruction *)LLVMBC::Internal::resolve_proxy(ptr);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)this);
    this_01 = (Instruction *)0x0;
    if (VVar3 == GetElementPtr) {
      this_01 = this;
    }
  }
  if (this_01 != (Instruction *)0x0) {
    pVVar4 = LLVMBC::Instruction::getOperand(this_01,0);
    pAVar9 = (AllocaInst *)0x0;
    if (pVVar4 != (Value *)0x0) {
      this_00 = (AllocaInst *)LLVMBC::Internal::resolve_proxy(pVVar4);
      VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
      pAVar9 = (AllocaInst *)0x0;
      if (VVar3 == Alloca) {
        pAVar9 = this_00;
      }
    }
    if (pAVar9 != (AllocaInst *)0x0) {
      uVar1 = (impl->alloca_tracking)._M_h._M_bucket_count;
      uVar5 = (ulong)pAVar9 % uVar1;
      p_Var6 = (impl->alloca_tracking)._M_h._M_buckets[uVar5];
      p_Var7 = (__node_base_ptr)0x0;
      if ((p_Var6 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, pAVar9 != (AllocaInst *)p_Var6->_M_nxt[1]._M_nxt
         )) {
        while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var7 = (__node_base_ptr)0x0;
          if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
             (p_Var7 = p_Var6, pAVar9 == (AllocaInst *)p_Var2[1]._M_nxt)) goto LAB_00156c95;
        }
        p_Var7 = (__node_base_ptr)0x0;
      }
LAB_00156c95:
      if (p_Var7 == (__node_base_ptr)0x0) {
        p_Var8 = (__node_type *)0x0;
      }
      else {
        p_Var8 = (__node_type *)p_Var7->_M_nxt;
      }
      if (p_Var8 != (__node_type *)0x0) {
        __return_storage_ptr__->alloca_inst = pAVar9;
        pVVar4 = LLVMBC::Instruction::getOperand(this_01,2);
        __return_storage_ptr__->index = pVVar4;
        (__return_storage_ptr__->itr).
        super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
        ._M_cur = p_Var8;
        __return_storage_ptr__->cbv_handle =
             *(Value **)
              ((long)&(p_Var8->
                      super__Hash_node_value<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>
                      ._M_storage._M_storage + 8);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->itr).
  super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
  ._M_cur = (__node_type *)0x0;
  __return_storage_ptr__->cbv_handle = (Value *)0x0;
  __return_storage_ptr__->alloca_inst = (AllocaInst *)0x0;
  __return_storage_ptr__->index = (Value *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static AllocaTrackedIndex gep_pointer_to_alloca_tracked_inst(Converter::Impl &impl, const llvm::Value *ptr)
{
	if (const auto *gep_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(ptr))
	{
		if (const auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(gep_inst->getOperand(0)))
		{
			auto itr = impl.alloca_tracking.find(alloca_inst);
			if (itr != impl.alloca_tracking.end())
				return { alloca_inst, gep_inst->getOperand(2), itr, itr->second.cbv_handle };
		}
	}

	return {};
}